

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O0

bool soul::is_type<soul::AST::Statement,soul::AST::Statement>
               (pool_ptr<soul::AST::Statement> *object)

{
  Statement *pSVar1;
  pool_ptr<soul::AST::Statement> *object_local;
  
  pSVar1 = pool_ptr<soul::AST::Statement>::get(object);
  return pSVar1 != (Statement *)0x0;
}

Assistant:

inline bool is_type (pool_ptr<SrcType> object)
{
    if (object.get() == nullptr)
        return false;

    if constexpr (std::is_same<TargetType, SrcType>::value)
        return true;
    else
        return dynamic_cast<TargetType*> (object.get()) != nullptr;
}